

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_char32_t_*>::Print(char32_t *str,ostream *os)

{
  allocator<char32_t> local_39;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_38;
  ostream *local_18;
  ostream *os_local;
  char32_t *str_local;
  
  local_18 = os;
  os_local = (ostream *)str;
  if (str == (char32_t *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::allocator<char32_t>::allocator(&local_39);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_38,str,&local_39);
    UniversalPrint<std::__cxx11::u32string>(&local_38,local_18);
    std::__cxx11::u32string::~u32string((u32string *)&local_38);
    std::allocator<char32_t>::~allocator(&local_39);
  }
  return;
}

Assistant:

static void Print(const char32_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::u32string(str), os);
    }
  }